

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O3

wchar_t uriDissectQueryMallocExMmA
                  (UriQueryListA **dest,wchar_t *itemCount,char *first,char *afterLast,
                  UriBool plusToSpace,UriBreakConversion breakConversion,UriMemoryManager *memory)

{
  UriBool UVar1;
  wchar_t wVar2;
  char *keyAfter;
  UriQueryListStructA **ppUVar3;
  char *valueFirst;
  char *pcVar4;
  char *valueAfter;
  char *pcVar5;
  wchar_t *itemCount_00;
  wchar_t nullCounter;
  
  itemCount_00 = &nullCounter;
  if (itemCount != (wchar_t *)0x0) {
    itemCount_00 = itemCount;
  }
  if (afterLast == (char *)0x0 || (first == (char *)0x0 || dest == (UriQueryListA **)0x0)) {
    return L'\x02';
  }
  if (afterLast < first) {
    return L'\t';
  }
  if (memory == (UriMemoryManager *)0x0) {
    memory = &defaultMemoryManager;
  }
  else {
    UVar1 = uriMemoryManagerIsComplete(memory);
    if (UVar1 != 1) {
      return L'\n';
    }
  }
  *dest = (UriQueryListA *)0x0;
  *itemCount_00 = L'\0';
  ppUVar3 = dest;
  pcVar5 = first;
  if (first < afterLast) {
    pcVar4 = (char *)0x0;
    valueFirst = (char *)0x0;
    keyAfter = (char *)0x0;
    do {
      if (*first == '=') {
        if (keyAfter == (char *)0x0) {
          valueFirst = first + 1;
          keyAfter = first;
          pcVar4 = valueFirst;
        }
      }
      else if (*first == '&') {
        valueAfter = first;
        if (valueFirst == (char *)0x0) {
          valueFirst = (char *)0x0;
          keyAfter = first;
          valueAfter = pcVar4;
        }
        UVar1 = uriAppendQueryItemA(ppUVar3,itemCount_00,pcVar5,keyAfter,valueFirst,valueAfter,
                                    plusToSpace,breakConversion,memory);
        if (UVar1 == 0) goto LAB_001b5b47;
        if (ppUVar3 == (UriQueryListStructA **)0x0) {
          ppUVar3 = (UriQueryListStructA **)0x0;
        }
        else if (*ppUVar3 != (UriQueryListA *)0x0) {
          ppUVar3 = &(*ppUVar3)->next;
        }
        pcVar5 = first + 1;
        if (afterLast <= pcVar5) {
          pcVar5 = (char *)0x0;
        }
        valueFirst = (char *)0x0;
        keyAfter = (char *)0x0;
        pcVar4 = (char *)0x0;
      }
      first = first + 1;
    } while (first != afterLast);
    if (valueFirst != (char *)0x0) goto LAB_001b5b29;
  }
  else {
    pcVar4 = (char *)0x0;
    afterLast = first;
  }
  keyAfter = afterLast;
  afterLast = pcVar4;
  valueFirst = (char *)0x0;
LAB_001b5b29:
  UVar1 = uriAppendQueryItemA(ppUVar3,itemCount_00,pcVar5,keyAfter,valueFirst,afterLast,plusToSpace,
                              breakConversion,memory);
  wVar2 = L'\0';
  if (UVar1 == 0) {
LAB_001b5b47:
    *itemCount_00 = L'\0';
    uriFreeQueryListMmA(*dest,memory);
    wVar2 = L'\x03';
  }
  return wVar2;
}

Assistant:

int URI_FUNC(DissectQueryMallocExMm)(URI_TYPE(QueryList) ** dest, int * itemCount,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const URI_CHAR * walk = first;
	const URI_CHAR * keyFirst = first;
	const URI_CHAR * keyAfter = NULL;
	const URI_CHAR * valueFirst = NULL;
	const URI_CHAR * valueAfter = NULL;
	URI_TYPE(QueryList) ** prevNext = dest;
	int nullCounter;
	int * itemsAppended = (itemCount == NULL) ? &nullCounter : itemCount;

	if ((dest == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}

	if (first > afterLast) {
		return URI_ERROR_RANGE_INVALID;
	}

	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	*dest = NULL;
	*itemsAppended = 0;

	/* Parse query string */
	for (; walk < afterLast; walk++) {
		switch (*walk) {
		case _UT('&'):
			if (valueFirst != NULL) {
				valueAfter = walk;
			} else {
				keyAfter = walk;
			}

			if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended,
					keyFirst, keyAfter, valueFirst, valueAfter,
					plusToSpace, breakConversion, memory)
					== URI_FALSE) {
				/* Free list we built */
				*itemsAppended = 0;
				URI_FUNC(FreeQueryListMm)(*dest, memory);
				return URI_ERROR_MALLOC;
			}

			/* Make future items children of the current */
			if ((prevNext != NULL) && (*prevNext != NULL)) {
				prevNext = &((*prevNext)->next);
			}

			if (walk + 1 < afterLast) {
				keyFirst = walk + 1;
			} else {
				keyFirst = NULL;
			}
			keyAfter = NULL;
			valueFirst = NULL;
			valueAfter = NULL;
			break;

		case _UT('='):
			/* NOTE: WE treat the first '=' as a separator, */
			/*       all following go into the value part   */
			if (keyAfter == NULL) {
				keyAfter = walk;
				if (walk + 1 <= afterLast) {
					valueFirst = walk + 1;
					valueAfter = walk + 1;
				}
			}
			break;

		default:
			break;
		}
	}

	if (valueFirst != NULL) {
		/* Must be key/value pair */
		valueAfter = walk;
	} else {
		/* Must be key only */
		keyAfter = walk;
	}

	if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended, keyFirst, keyAfter,
			valueFirst, valueAfter, plusToSpace, breakConversion, memory)
			== URI_FALSE) {
		/* Free list we built */
		*itemsAppended = 0;
		URI_FUNC(FreeQueryListMm)(*dest, memory);
		return URI_ERROR_MALLOC;
	}

	return URI_SUCCESS;
}